

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O2

void __thiscall QErrorMessagePrivate::retranslateStrings(QErrorMessagePrivate *this)

{
  QCheckBox *this_00;
  QPushButton *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->again;
  QErrorMessage::tr((QString *)&local_40,"&Show this message again",(char *)0x0,-1);
  QAbstractButton::setText(&this_00->super_QAbstractButton,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  this_01 = this->ok;
  QErrorMessage::tr((QString *)&local_40,"&OK",(char *)0x0,-1);
  QAbstractButton::setText(&this_01->super_QAbstractButton,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QErrorMessagePrivate::retranslateStrings()
{
    again->setText(QErrorMessage::tr("&Show this message again"));
    ok->setText(QErrorMessage::tr("&OK"));
}